

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

QTableWidgetItem * __thiscall QTableWidget::verticalHeaderItem(QTableWidget *this,int row)

{
  QTableWidgetPrivate *pQVar1;
  QTableWidgetItem *pQVar2;
  undefined4 in_ESI;
  QTableWidgetPrivate *d;
  undefined4 in_stack_fffffffffffffff0;
  int section;
  
  pQVar1 = d_func((QTableWidget *)0x8da8fb);
  section = (int)((ulong)pQVar1 >> 0x20);
  QTableWidgetPrivate::tableModel((QTableWidgetPrivate *)0x8da908);
  pQVar2 = QTableModel::verticalHeaderItem
                     ((QTableModel *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),section);
  return pQVar2;
}

Assistant:

QTableWidgetItem *QTableWidget::verticalHeaderItem(int row) const
{
    Q_D(const QTableWidget);
    return d->tableModel()->verticalHeaderItem(row);
}